

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O0

void Abc_SclTimeIncUpdateLevel_rec(Abc_Obj_t *pObj)

{
  uint uVar1;
  int iVar2;
  Abc_Obj_t *pObj_00;
  int local_1c;
  int LevelNew;
  int i;
  Abc_Obj_t *pFanout;
  Abc_Obj_t *pObj_local;
  
  uVar1 = Abc_ObjLevelNew(pObj);
  if (((uVar1 != *(uint *)&pObj->field_0x14 >> 0xc) || (iVar2 = Abc_ObjIsNode(pObj), iVar2 == 0)) ||
     (iVar2 = Abc_ObjFaninNum(pObj), iVar2 < 1)) {
    *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xfff | uVar1 << 0xc;
    for (local_1c = 0; iVar2 = Abc_ObjFanoutNum(pObj), local_1c < iVar2; local_1c = local_1c + 1) {
      pObj_00 = Abc_ObjFanout(pObj,local_1c);
      Abc_SclTimeIncUpdateLevel_rec(pObj_00);
    }
  }
  return;
}

Assistant:

void Abc_SclTimeIncUpdateLevel_rec( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanout;
    int i, LevelNew = Abc_ObjLevelNew(pObj);
    if ( LevelNew == (int)pObj->Level && Abc_ObjIsNode(pObj) && Abc_ObjFaninNum(pObj) > 0 )
        return;
    pObj->Level = LevelNew;
    Abc_ObjForEachFanout( pObj, pFanout, i )
        Abc_SclTimeIncUpdateLevel_rec( pFanout );
}